

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

RTCSubdivisionMode embree::parseSubdivMode(Ref<embree::XML> *xml)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  bool bVar5;
  runtime_error *this;
  string subdiv_mode;
  char *in_stack_ffffffffffffff48;
  undefined2 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff52;
  undefined1 in_stack_ffffffffffffff53;
  undefined1 in_stack_ffffffffffffff54;
  undefined1 in_stack_ffffffffffffff55;
  undefined1 in_stack_ffffffffffffff56;
  undefined1 in_stack_ffffffffffffff57;
  string local_90 [32];
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  XML *in_stack_ffffffffffffff98;
  allocator local_59;
  string local_58 [32];
  string local_38 [44];
  RTCSubdivisionMode local_c;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"subdiv_mode",&local_59);
  XML::parm(in_stack_ffffffffffffff98,
            (string *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  uVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff57,
                                   CONCAT16(in_stack_ffffffffffffff56,
                                            CONCAT15(in_stack_ffffffffffffff55,
                                                     CONCAT14(in_stack_ffffffffffffff54,
                                                              CONCAT13(in_stack_ffffffffffffff53,
                                                                       CONCAT12(
                                                  in_stack_ffffffffffffff52,
                                                  in_stack_ffffffffffffff50)))))),
                          in_stack_ffffffffffffff48);
  if ((bool)uVar1) {
    local_c = RTC_SUBDIVISION_MODE_NO_BOUNDARY;
  }
  else {
    uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff56,
                                                    CONCAT15(in_stack_ffffffffffffff55,
                                                             CONCAT14(in_stack_ffffffffffffff54,
                                                                      CONCAT13(
                                                  in_stack_ffffffffffffff53,
                                                  CONCAT12(in_stack_ffffffffffffff52,
                                                           in_stack_ffffffffffffff50)))))),
                            in_stack_ffffffffffffff48);
    if ((bool)uVar2) {
      local_c = RTC_SUBDIVISION_MODE_SMOOTH_BOUNDARY;
    }
    else {
      uVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(in_stack_ffffffffffffff55,
                                                                     CONCAT14(
                                                  in_stack_ffffffffffffff54,
                                                  CONCAT13(in_stack_ffffffffffffff53,
                                                           CONCAT12(in_stack_ffffffffffffff52,
                                                                    in_stack_ffffffffffffff50)))))),
                              in_stack_ffffffffffffff48);
      if ((bool)uVar3) {
        local_c = RTC_SUBDIVISION_MODE_PIN_CORNERS;
      }
      else {
        uVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(
                                                  in_stack_ffffffffffffff54,
                                                  CONCAT13(in_stack_ffffffffffffff53,
                                                           CONCAT12(in_stack_ffffffffffffff52,
                                                                    in_stack_ffffffffffffff50)))))),
                                in_stack_ffffffffffffff48);
        if ((bool)uVar4) {
          local_c = RTC_SUBDIVISION_MODE_PIN_BOUNDARY;
        }
        else {
          bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,
                                                  CONCAT13(in_stack_ffffffffffffff53,
                                                           CONCAT12(in_stack_ffffffffffffff52,
                                                                    in_stack_ffffffffffffff50)))))),
                                  in_stack_ffffffffffffff48);
          if (bVar5) {
            local_c = RTC_SUBDIVISION_MODE_PIN_ALL;
          }
          else {
            bVar5 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,
                                                  CONCAT13(bVar5,CONCAT12(in_stack_ffffffffffffff52,
                                                                          in_stack_ffffffffffffff50)
                                                          ))))),in_stack_ffffffffffffff48);
            if (bVar5) {
              this = (runtime_error *)__cxa_allocate_exception(0x10);
              std::operator+((char *)in_stack_ffffffffffffff98,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
              std::runtime_error::runtime_error(this,local_90);
              __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            local_c = RTC_SUBDIVISION_MODE_SMOOTH_BOUNDARY;
          }
        }
      }
    }
  }
  std::__cxx11::string::~string(local_38);
  return local_c;
}

Assistant:

RTCSubdivisionMode parseSubdivMode(const Ref<XML>& xml)
  {
    std::string subdiv_mode = xml->parm("subdiv_mode");
    if      (subdiv_mode == "no_boundary" ) return RTC_SUBDIVISION_MODE_NO_BOUNDARY;
    else if (subdiv_mode == "smooth"      ) return RTC_SUBDIVISION_MODE_SMOOTH_BOUNDARY;
    else if (subdiv_mode == "pin_corners" ) return RTC_SUBDIVISION_MODE_PIN_CORNERS;
    else if (subdiv_mode == "pin_boundary") return RTC_SUBDIVISION_MODE_PIN_BOUNDARY;
    else if (subdiv_mode == "pin_all"     ) return RTC_SUBDIVISION_MODE_PIN_ALL;
    else if (subdiv_mode != ""            ) THROW_RUNTIME_ERROR("invalid subdivision mode: "+subdiv_mode);
    return RTC_SUBDIVISION_MODE_SMOOTH_BOUNDARY;
  }